

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

s32 __thiscall
irr::gui::CGUITabControl::insertTab
          (CGUITabControl *this,s32 idx,IGUITab *tab,bool serializationMode)

{
  _func_int *p_Var1;
  pointer ppIVar2;
  int iVar3;
  u32 index;
  ulong uVar4;
  u32 idx_00;
  IGUITab *local_40;
  IGUITab *tab_local;
  
  if (tab == (IGUITab *)0x0) {
    return -1;
  }
  if ((int)((ulong)((long)(this->Tabs).m_data.
                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->Tabs).m_data.
                         super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) < idx &&
      !serializationMode) {
    return -1;
  }
  tab_local = tab;
  iVar3 = (**(code **)(*(long *)this + 0x160))(this,tab);
  if (-1 < iVar3) {
    return -1;
  }
  uVar4 = (ulong)((long)(this->Tabs).m_data.
                        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->Tabs).m_data.
                       super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  if (-1 < idx) {
    uVar4 = (ulong)(uint)idx;
  }
  index = (u32)uVar4;
  if ((CGUITabControl *)(tab->super_IGUIElement).Parent != this) {
    IGUIElement::addChildToEnd((IGUIElement *)this,&tab->super_IGUIElement);
  }
  (*(tab->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])(tab,0);
  p_Var1 = (_func_int *)
           ((long)&(tab->super_IGUIElement).Children.
                   super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                   ._M_impl._M_node.super__List_node_base._M_prev +
           (long)(tab->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3]);
  *(int *)p_Var1 = *(int *)p_Var1 + 1;
  if (serializationMode) {
    while (ppIVar2 = (this->Tabs).m_data.
                     super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
          (int)((ulong)((long)(this->Tabs).m_data.
                              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3) <=
          (int)index) {
      local_40 = (IGUITab *)0x0;
      core::array<irr::gui::IGUITab_*>::push_back(&this->Tabs,&local_40);
    }
    ppIVar2[uVar4] = tab;
    if (index == this->ActiveTabIndex) {
      setVisibleTab(this,index);
      (*(tab->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])(tab,1);
    }
  }
  else {
    core::array<irr::gui::IGUITab_*>::insert(&this->Tabs,&tab_local,index);
    iVar3 = this->ActiveTabIndex;
    if (iVar3 == -1) {
      this->ActiveTabIndex = index;
      idx_00 = index;
    }
    else {
      if (iVar3 < (int)index) goto LAB_00238e0a;
      this->ActiveTabIndex = iVar3 + 1U;
      idx_00 = iVar3 + 1U;
    }
    setVisibleTab(this,idx_00);
  }
LAB_00238e0a:
  recalculateScrollBar(this);
  return index;
}

Assistant:

s32 CGUITabControl::insertTab(s32 idx, IGUITab *tab, bool serializationMode)
{
	if (!tab)
		return -1;
	if (idx > (s32)Tabs.size() && !serializationMode) // idx == Tabs.size() is indeed OK here as core::array can handle that
		return -1;
	// Not allowing to add same tab twice as it would make things complicated (serialization or setting active visible)
	if (getTabIndex(tab) >= 0)
		return -1;

	if (idx < 0)
		idx = (s32)Tabs.size();

	if (tab->getParent() != this)
		this->addChildToEnd(tab);

	tab->setVisible(false);

	tab->grab();

	if (serializationMode) {
		while (idx >= (s32)Tabs.size()) {
			Tabs.push_back(0);
		}
		Tabs[idx] = tab;

		if (idx == ActiveTabIndex) { // in serialization that can happen for any index
			setVisibleTab(ActiveTabIndex);
			tab->setVisible(true);
		}
	} else {
		Tabs.insert(tab, (u32)idx);

		if (ActiveTabIndex == -1) {
			ActiveTabIndex = idx;
			setVisibleTab(ActiveTabIndex);
		} else if (idx <= ActiveTabIndex) {
			++ActiveTabIndex;
			setVisibleTab(ActiveTabIndex);
		}
	}

	recalculateScrollBar();

	return idx;
}